

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O2

double icu_63::GregorianCalendar::computeJulianDayOfYear
                 (UBool isGregorian,int32_t year,UBool *isLeap)

{
  int32_t iVar1;
  bool bVar2;
  double dVar3;
  
  *isLeap = (year & 3U) == 0;
  iVar1 = ClockMath::floorDivide(year + -1,4);
  dVar3 = (double)(year + -1) * 365.0 + (double)iVar1 + 1721423.0;
  if (isGregorian != '\0') {
    if (*isLeap == '\0') {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (year % 100 == 0) {
        bVar2 = year % 400 == 0;
      }
    }
    *isLeap = bVar2;
    iVar1 = Grego::gregorianShift(year);
    dVar3 = dVar3 + (double)iVar1;
  }
  return dVar3;
}

Assistant:

double GregorianCalendar::computeJulianDayOfYear(UBool isGregorian,
                                                 int32_t year, UBool& isLeap)
{
    isLeap = year%4 == 0;
    int32_t y = year - 1;
    double julianDay = 365.0*y + ClockMath::floorDivide(y, 4) + (kJan1_1JulianDay - 3);

    if (isGregorian) {
        isLeap = isLeap && ((year%100 != 0) || (year%400 == 0));
        // Add 2 because Gregorian calendar starts 2 days after Julian calendar
        julianDay += Grego::gregorianShift(year);
    }

    return julianDay;
}